

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

char * fmt_bit_array(bit_array_t *bit_array)

{
  ushort uVar1;
  byte_t *pbVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = bit_array->length;
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = uVar1 - 1;
    if (0xfd < uVar3) {
      uVar3 = 0xfe;
    }
    uVar4 = (ulong)(uVar3 + 1);
    pbVar2 = bit_array->buffer + ((ulong)uVar1 - 1);
    uVar5 = 0;
    do {
      fmt_bit_array::str[uVar5] = *pbVar2;
      uVar5 = uVar5 + 1;
      pbVar2 = pbVar2 + -1;
    } while (uVar4 != uVar5);
  }
  fmt_bit_array::str[uVar4] = '\0';
  return fmt_bit_array::str;
}

Assistant:

char * fmt_bit_array(const bit_array_t *bit_array) {
    static char str[MAX_BIT_STR] = {0};

    int j = 0;
    for(int i = bit_array->length-1; i>=0 && (j < sizeof(str)-2); i--) {
        str[j] = bit_array->buffer[i];
        j++;
    }

    str[j] = 0;
    return str;
}